

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O2

string * __thiscall
queryparse::transform_string_abi_cxx11_(string *__return_storage_ptr__,queryparse *this,node *n)

{
  undefined8 *puVar1;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_> *atom
  ;
  undefined8 *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(undefined8 **)(this + 8);
  for (puVar2 = *(undefined8 **)this; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    transform_char((node *)*puVar2);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string transform_string(const parse_tree::node &n) {
    auto *root = &n;
    std::string result;
    for (auto &atom : root->children) {
        result += transform_char(*atom);
    }

    return result;
}